

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O0

expected<void,_std::error_code> * __thiscall
jaegertracing::Tracer::Inject
          (expected<void,_std::error_code> *__return_storage_ptr__,Tracer *this,SpanContext *ctx,
          ostream *writer)

{
  error_category *peVar1;
  error_code e;
  SpanContext *local_98;
  expected<void,_std::error_code> local_70;
  ulong local_58;
  undefined8 local_50;
  expected<void,_std::error_code> local_48;
  SpanContext *local_30;
  SpanContext *jaegerCtx;
  ostream *writer_local;
  SpanContext *ctx_local;
  Tracer *this_local;
  
  jaegerCtx = (SpanContext *)writer;
  writer_local = (ostream *)ctx;
  ctx_local = (SpanContext *)this;
  this_local = (Tracer *)__return_storage_ptr__;
  if (ctx == (SpanContext *)0x0) {
    local_98 = (SpanContext *)0x0;
  }
  else {
    peVar1 = (error_category *)0x0;
    local_98 = (SpanContext *)
               __dynamic_cast(ctx,&opentracing::v3::SpanContext::typeinfo,&SpanContext::typeinfo);
    writer = (ostream *)peVar1;
  }
  local_30 = local_98;
  if (local_98 == (SpanContext *)0x0) {
    local_58 = opentracing::v3::invalid_span_context_error;
    local_50 = DAT_00516a90;
    e._M_cat = (error_category *)writer;
    e._0_8_ = DAT_00516a90;
    opentracing::v3::make_expected_from_error<void,std::error_code>
              (&local_48,(v3 *)(opentracing::v3::invalid_span_context_error & 0xffffffff),e);
    opentracing::v3::expected<void,_std::error_code>::expected<true,_0>
              (__return_storage_ptr__,&local_48);
    opentracing::v3::expected<void,_std::error_code>::~expected(&local_48);
  }
  else {
    propagation::BinaryPropagator::inject(&this->_binaryPropagator,local_98,(ostream *)jaegerCtx);
    opentracing::v3::make_expected();
    opentracing::v3::expected<void,_std::error_code>::expected<true,_0>
              (__return_storage_ptr__,&local_70);
    opentracing::v3::expected<void,_std::error_code>::~expected(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<void> Inject(const opentracing::SpanContext& ctx,
                                       std::ostream& writer) const override
    {
        const auto* jaegerCtx = dynamic_cast<const SpanContext*>(&ctx);
        if (!jaegerCtx) {
            return opentracing::make_expected_from_error<void>(
                opentracing::invalid_span_context_error);
        }
        _binaryPropagator.inject(*jaegerCtx, writer);
        return opentracing::make_expected();
    }